

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::PrintToChar<char16_t>(char16_t value,iu_ostream *os)

{
  ostream *poVar1;
  string local_68;
  char16_t local_48 [4];
  char16_t str [2];
  string local_38;
  iu_ostream *local_18;
  iu_ostream *os_local;
  char16_t value_local;
  
  local_18 = os;
  os_local._6_2_ = value;
  if (value == L'\0') {
    std::operator<<(os,"\\0");
  }
  else if ((ushort)value < 0x20) {
    poVar1 = std::operator<<(os,"0x");
    ToHexString<char16_t>(&local_38,os_local._6_2_);
    std::operator<<(poVar1,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    local_48[1] = 0;
    local_48[0] = value;
    poVar1 = std::operator<<(os,"\'");
    ShowAnyCString<char16_t>(&local_68,local_48);
    poVar1 = std::operator<<(poVar1,(string *)&local_68);
    std::operator<<(poVar1,"\'");
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

void PrintToChar(const T value, iu_ostream* os)
{
    // char or unsigned char の時に、 0 が NULL 文字にならないように修正
    if( value == 0 )
    {
        *os << "\\0";
    }
    else if( static_cast<int>(value) < 0x20 )
    {
        *os << "0x" << ToHexString(value);
    }
    else
    {
        const T str[2] = { value, 0 };
        *os << "\'" << detail::ShowAnyCString(str) << "\'";
    }
}